

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
* __thiscall
google::protobuf::io::Printer::
WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
          (Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
           *__return_storage_ptr__,Printer *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars)

{
  anon_class_8_1_8991fb9c callback;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Printer *this_local;
  
  local_20 = vars;
  vars_local = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this;
  this_local = (Printer *)__return_storage_ptr__;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map(&local_40,vars);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>,std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>>>
  ::
  emplace_back<google::protobuf::io::Printer::WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>(absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
            ((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>,std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>>(std::basic_string_view<char,std::char_traits<char>>)>>>
              *)&this->var_lookups_,(anon_class_32_1_8992cb2a_conflict *)&local_40);
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>(absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&&)
  ::{lambda(std::basic_string_view<char,std::char_traits<char>>)#1}::~WithVars
            ((_lambda_std__basic_string_view<char,std::char_traits<char>>__1_ *)&local_40);
  absl::lts_20250127::
  MakeCleanup<,google::protobuf::io::Printer::WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>(absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&&)::_lambda()_1_>
            (__return_storage_ptr__,(lts_20250127 *)this,callback);
  return __return_storage_ptr__;
}

Assistant:

auto Printer::WithVars(Map&& vars) {
  var_lookups_.emplace_back(
      [vars = std::forward<Map>(vars)](
          absl::string_view var) -> absl::optional<ValueView> {
        auto it = vars.find(ToStringKey<Map>(var));
        if (it == vars.end()) {
          return absl::nullopt;
        }
        return ValueView(it->second);
      });
  return absl::MakeCleanup([this] { var_lookups_.pop_back(); });
}